

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

pString string_remove(pString str,size_t index,size_t len)

{
  pString res;
  size_t len_local;
  size_t index_local;
  pString str_local;
  
  if ((index <= str->len) && (index + len <= str->len)) {
    str_local = string_allocate_memory(str->len - len);
    if (str_local == (pString)0x0) {
      printf("string_remove: string_allocate_memory failed\n");
      str_local = (pString)0x0;
    }
    else {
      string_copy_chars(str_local->buf,str->buf,index);
      string_copy_chars(str_local->buf + index,str->buf + len + index,(str->len - index) - len);
    }
    return str_local;
  }
  printf("string_remove: index out of range\n");
  exit(1);
}

Assistant:

pString string_remove(pString str, size_t index, size_t len)
{
    if (index > str->len || index + len > str->len)
    {
        log("string_remove: index out of range");
        exit(1);
    }
    pString res = string_allocate_memory(str->len - len);
    if (res == NULL)
    {
        log("string_remove: string_allocate_memory failed");
        return NULL;
    }
    string_copy_chars(res->buf, str->buf, index);
    string_copy_chars(res->buf + index, str->buf + index + len, str->len - index - len);
    return res;
}